

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Asyncify.cpp
# Opt level: O2

Expression * __thiscall
wasm::anon_unknown_0::AsyncifyBuilder::makeStateCheck(AsyncifyBuilder *this,State value)

{
  GlobalGet *left;
  Const *right;
  Binary *pBVar1;
  Name name;
  anon_union_16_6_1532cd5a_for_Literal_0 local_38;
  undefined8 local_28;
  
  name.super_IString.str._M_str = DAT_011756f8;
  name.super_IString.str._M_len = wasm::(anonymous_namespace)::ASYNCIFY_STATE;
  left = Builder::makeGlobalGet(&this->super_Builder,name,(Type)0x2);
  local_28 = 2;
  local_38.i32 = value;
  right = Builder::makeConst(&this->super_Builder,(Literal *)&local_38.func);
  pBVar1 = Builder::makeBinary(&this->super_Builder,EqInt32,(Expression *)left,(Expression *)right);
  Literal::~Literal((Literal *)&local_38.func);
  return (Expression *)pBVar1;
}

Assistant:

Expression* makeStateCheck(State value) {
    return makeBinary(EqInt32,
                      makeGlobalGet(ASYNCIFY_STATE, Type::i32),
                      makeConst(Literal(int32_t(value))));
  }